

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::reparentWidgetWindows
          (QWidgetPrivate *this,QWidget *parentWithWindow,WindowFlags windowFlags)

{
  QWidgetData **ppQVar1;
  QWExtra *pQVar2;
  QWidget *pQVar3;
  QDebug QVar4;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var5;
  QWindow *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QDebug local_b0;
  QDebug local_a8;
  QTextStream *local_a0;
  undefined1 local_98 [8];
  undefined4 local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined4 local_7c;
  char *local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QTextStream *local_58;
  undefined1 local_50 [8];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar2 == (QWExtra *)0x0) {
    _Var5._M_head_impl = (QTLWExtra *)0x0;
  }
  else {
    _Var5._M_head_impl =
         *(QTLWExtra **)
          &(pQVar2->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
    ;
  }
  if ((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var5._M_head_impl ==
      (QTLWExtra *)0x0) {
    pQVar6 = (QWindow *)0x0;
  }
  else {
    pQVar6 = *(QWindow **)((long)_Var5._M_head_impl + 0x20);
  }
  if (pQVar6 == (QWindow *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      reparentWidgetWindowChildren(this,parentWithWindow);
      return;
    }
    goto LAB_0030e5e5;
  }
  if (parentWithWindow == (QWidget *)0x0) {
    lcWidgetWindow();
    if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_90 = 2;
      local_8c = 0;
      uStack_84 = 0;
      local_7c = 0;
      local_78 = lcWidgetWindow::category.name;
      QMessageLogger::debug();
      QVar4.stream = local_70.stream;
      QVar7.m_data = (storage_type *)0x6;
      QVar7.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      local_b0.stream = local_70.stream;
      *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_60,(QWindow *)&local_b0);
      QVar4.stream = local_60.stream;
      QVar8.m_data = (storage_type *)0x10;
      QVar8.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_b0);
      QDebug::~QDebug(&local_70);
    }
LAB_0030e5b2:
    QWindow::setTransientParent(pQVar6);
  }
  else {
    if (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      do {
        pQVar3 = *(QWidget **)(*(long *)&parentWithWindow->field_0x8 + 0x10);
        if (pQVar3 == (QWidget *)0x0) break;
        ppQVar1 = &parentWithWindow->data;
        parentWithWindow = pQVar3;
      } while ((((*ppQVar1)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
      lcWidgetWindow();
      if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
         ) {
        local_90 = 2;
        local_8c = 0;
        uStack_84 = 0;
        local_7c = 0;
        local_78 = lcWidgetWindow::category.name;
        QMessageLogger::debug();
        QVar4.stream = local_70.stream;
        QVar11.m_data = (storage_type *)0x7;
        QVar11.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar11);
        QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        local_68.stream = local_70.stream;
        *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
        ::operator<<((Stream *)&local_60,(QWindow *)&local_68);
        QVar4.stream = local_60.stream;
        QVar12.m_data = (storage_type *)0x13;
        QVar12.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar12);
        QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_60.stream,' ');
        }
        local_58 = (QTextStream *)local_60.stream;
        *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
        ::operator<<((Stream *)local_50,(QWindow *)&local_58);
        QDebug::~QDebug((QDebug *)local_50);
        QDebug::~QDebug((QDebug *)&local_58);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
        QDebug::~QDebug(&local_70);
      }
      goto LAB_0030e5b2;
    }
    lcWidgetWindow();
    if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_90 = 2;
      local_8c = 0;
      uStack_84 = 0;
      local_7c = 0;
      local_78 = lcWidgetWindow::category.name;
      QMessageLogger::debug();
      QVar4.stream = local_70.stream;
      QVar9.m_data = &DAT_0000000b;
      QVar9.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      local_a8.stream = local_70.stream;
      *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_60,(QWindow *)&local_a8);
      QVar4.stream = local_60.stream;
      QVar10.m_data = (storage_type *)0x4;
      QVar10.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      local_a0 = (QTextStream *)local_60.stream;
      *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
      ::operator<<((Stream *)local_98,(QWindow *)&local_a0);
      QDebug::~QDebug((QDebug *)local_98);
      QDebug::~QDebug((QDebug *)&local_a0);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_a8);
      QDebug::~QDebug(&local_70);
    }
    QWindow::setTransientParent(pQVar6);
  }
  QWindow::setParent(pQVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0030e5e5:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::reparentWidgetWindows(QWidget *parentWithWindow, Qt::WindowFlags windowFlags)
{
    if (QWindow *window = windowHandle()) {
        // Reparent this QWindow, and all QWindow children will follow
        if (parentWithWindow) {
            if (windowFlags & Qt::Window) {
                // Top level windows can only have transient parents,
                // and the transient parent must be another top level.
                QWidget *topLevel = parentWithWindow->window();
                auto *transientParent = topLevel->windowHandle();
                Q_ASSERT(transientParent);
                qCDebug(lcWidgetWindow) << "Setting" << window << "transient parent to" << transientParent;
                window->setTransientParent(transientParent);
                window->setParent(nullptr);
            } else {
                auto *parentWindow = parentWithWindow->windowHandle();
                qCDebug(lcWidgetWindow) << "Reparenting" << window << "into" << parentWindow;
                window->setTransientParent(nullptr);
                window->setParent(parentWindow);
            }
        } else {
            qCDebug(lcWidgetWindow) << "Making" << window << "top level window";
            window->setTransientParent(nullptr);
            window->setParent(nullptr);
        }
    } else {
        reparentWidgetWindowChildren(parentWithWindow);
    }
}